

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_error_manager.hpp
# Opt level: O3

ErrorData * __thiscall
duckdb::TaskErrorManager::GetError(ErrorData *__return_storage_ptr__,TaskErrorManager *this)

{
  pointer pcVar1;
  size_t sVar2;
  ExceptionType EVar3;
  undefined4 uVar4;
  int iVar5;
  reference pvVar6;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_38;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar5 == 0) {
    pvVar6 = vector<duckdb::ErrorData,_true>::operator[](&this->exceptions,0);
    EVar3 = pvVar6->type;
    __return_storage_ptr__->initialized = pvVar6->initialized;
    __return_storage_ptr__->type = EVar3;
    (__return_storage_ptr__->raw_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->raw_message).field_2;
    pcVar1 = (pvVar6->raw_message)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->raw_message,pcVar1,
               pcVar1 + (pvVar6->raw_message)._M_string_length);
    (__return_storage_ptr__->final_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->final_message).field_2;
    pcVar1 = (pvVar6->final_message)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->final_message,pcVar1,
               pcVar1 + (pvVar6->final_message)._M_string_length);
    local_38._M_h = (__hashtable_alloc *)&__return_storage_ptr__->extra_info;
    (__return_storage_ptr__->extra_info)._M_h._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->extra_info)._M_h._M_bucket_count =
         (pvVar6->extra_info)._M_h._M_bucket_count;
    (__return_storage_ptr__->extra_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->extra_info)._M_h._M_element_count =
         (pvVar6->extra_info)._M_h._M_element_count;
    uVar4 = *(undefined4 *)&(pvVar6->extra_info)._M_h._M_rehash_policy.field_0x4;
    sVar2 = (pvVar6->extra_info)._M_h._M_rehash_policy._M_next_resize;
    (__return_storage_ptr__->extra_info)._M_h._M_rehash_policy._M_max_load_factor =
         (pvVar6->extra_info)._M_h._M_rehash_policy._M_max_load_factor;
    *(undefined4 *)&(__return_storage_ptr__->extra_info)._M_h._M_rehash_policy.field_0x4 = uVar4;
    (__return_storage_ptr__->extra_info)._M_h._M_rehash_policy._M_next_resize = sVar2;
    (__return_storage_ptr__->extra_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_38._M_h,&(pvVar6->extra_info)._M_h,&local_38);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar5);
}

Assistant:

ErrorData GetError() {
		lock_guard<mutex> elock(error_lock);
		D_ASSERT(!exceptions.empty());

		// FIXME: Should we try to get the biggest priority error?
		// In case the first exception is a StandardException but a regular Exception or a FatalException occurred
		// Maybe we should throw the more critical exception instead, as that changes behavior.
		auto &entry = exceptions[0];
		return entry;
	}